

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollisionPdu.cpp
# Opt level: O0

bool __thiscall DIS::CollisionPdu::operator==(CollisionPdu *this,CollisionPdu *rhs)

{
  bool bVar1;
  bool local_19;
  bool ivarsEqual;
  CollisionPdu *rhs_local;
  CollisionPdu *this_local;
  
  local_19 = EntityInformationFamilyPdu::operator==
                       (&this->super_EntityInformationFamilyPdu,
                        &rhs->super_EntityInformationFamilyPdu);
  bVar1 = EntityID::operator==(&this->_issuingEntityID,&rhs->_issuingEntityID);
  if (!bVar1) {
    local_19 = false;
  }
  bVar1 = EntityID::operator==(&this->_collidingEntityID,&rhs->_collidingEntityID);
  if (!bVar1) {
    local_19 = false;
  }
  bVar1 = EventID::operator==(&this->_eventID,&rhs->_eventID);
  if (!bVar1) {
    local_19 = false;
  }
  if (this->_collisionType != rhs->_collisionType) {
    local_19 = false;
  }
  if (this->_pad != rhs->_pad) {
    local_19 = false;
  }
  bVar1 = Vector3Float::operator==(&this->_velocity,&rhs->_velocity);
  if (!bVar1) {
    local_19 = false;
  }
  if ((this->_mass != rhs->_mass) || (NAN(this->_mass) || NAN(rhs->_mass))) {
    local_19 = false;
  }
  bVar1 = Vector3Float::operator==(&this->_location,&rhs->_location);
  if (!bVar1) {
    local_19 = false;
  }
  return local_19;
}

Assistant:

bool CollisionPdu::operator ==(const CollisionPdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = EntityInformationFamilyPdu::operator==(rhs);

     if( ! (_issuingEntityID == rhs._issuingEntityID) ) ivarsEqual = false;
     if( ! (_collidingEntityID == rhs._collidingEntityID) ) ivarsEqual = false;
     if( ! (_eventID == rhs._eventID) ) ivarsEqual = false;
     if( ! (_collisionType == rhs._collisionType) ) ivarsEqual = false;
     if( ! (_pad == rhs._pad) ) ivarsEqual = false;
     if( ! (_velocity == rhs._velocity) ) ivarsEqual = false;
     if( ! (_mass == rhs._mass) ) ivarsEqual = false;
     if( ! (_location == rhs._location) ) ivarsEqual = false;

    return ivarsEqual;
 }